

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backend_sdl.cpp
# Opt level: O3

int __thiscall
CGraphicsBackend_SDL_OpenGL::Init
          (CGraphicsBackend_SDL_OpenGL *this,char *pName,int *pScreen,int *pWindowWidth,
          int *pWindowHeight,int *pScreenWidth,int *pScreenHeight,int FsaaSamples,int Flags,
          int *pDesktopWidth,int *pDesktopHeight)

{
  uchar *puVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  undefined8 uVar6;
  SDL_Window *pSVar7;
  SDL_GLContext pvVar8;
  ICommandProcessor *pIVar9;
  void *pvVar10;
  ulong uVar11;
  int iVar12;
  char *fmt;
  CCommand *pCVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  long in_FS_OFFSET;
  CCommandBuffer local_80;
  SDL_version Linked;
  SDL_Rect ScreenPos;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  iVar4 = SDL_WasInit();
  if ((iVar4 == 0) && (iVar4 = SDL_InitSubSystem(), iVar4 < 0)) {
    uVar6 = SDL_GetError();
    fmt = "unable to init SDL video: %s";
  }
  else {
    iVar4 = SDL_GetNumVideoDisplays();
    this->m_NumScreens = iVar4;
    if (iVar4 < 1) {
      uVar6 = SDL_GetError();
      fmt = "unable to retrieve number of screens: %s";
    }
    else {
      iVar17 = *pScreen;
      iVar14 = iVar4 + -1;
      if (iVar17 < iVar4 + -1) {
        iVar14 = iVar17;
      }
      iVar4 = 0;
      if (-1 < iVar17) {
        iVar4 = iVar14;
      }
      *pScreen = iVar4;
      iVar4 = SDL_GetDisplayBounds(iVar4,&ScreenPos);
      if (iVar4 == 0) {
        iVar4 = (*(this->super_CGraphicsBackend_Threaded).super_IGraphicsBackend.
                  _vptr_IGraphicsBackend[0xd])
                          (this,(ulong)(uint)*pScreen,pDesktopWidth,pDesktopHeight);
        if ((char)iVar4 == '\0') {
          uVar6 = SDL_GetError();
          fmt = "unable to get desktop resolution: %s";
        }
        else {
          if ((*pWindowWidth == 0) || (*pWindowHeight == 0)) {
            *pWindowWidth = *pDesktopWidth;
            *pWindowHeight = *pDesktopHeight;
          }
          if ((Flags & 0x10U) != 0) {
            SDL_SetHint("SDL_VIDEO_X11_XRANDR","1");
          }
          SDL_GL_SetAttribute(5,1);
          SDL_GL_SetAttribute(0xd,FsaaSamples != 0);
          SDL_GL_SetAttribute(0xe,FsaaSamples);
          iVar4 = *pWindowWidth;
          if ((Flags & 1U) == 0) {
            iVar12 = 0;
            iVar17 = *pWindowHeight;
            iVar5 = *pDesktopWidth - iVar4;
            if ((iVar5 == 0 || *pDesktopWidth < iVar4) ||
               (iVar14 = *pDesktopHeight - iVar17, iVar14 == 0 || *pDesktopHeight < iVar17)) {
              iVar14 = 0;
            }
            else {
              iVar12 = iVar5 / 2;
              iVar14 = iVar14 / 2;
            }
          }
          else {
            iVar17 = *pWindowHeight;
            iVar12 = 0;
            iVar14 = 0;
          }
          pSVar7 = (SDL_Window *)
                   SDL_CreateWindow(pName,iVar12 + ScreenPos.x,iVar14 + ScreenPos.y,iVar4,iVar17,
                                    (Flags & 1U) +
                                    ((Flags & 8U) * 2 + (Flags & 4U) * 8 | (Flags & 0x20U) << 8) + 2
                                   );
          this->m_pWindow = pSVar7;
          if (pSVar7 == (SDL_Window *)0x0) {
            uVar6 = SDL_GetError();
            fmt = "unable to create window: %s";
          }
          else {
            SDL_GetWindowSize(pSVar7,pWindowWidth,pWindowHeight);
            pvVar8 = (SDL_GLContext)SDL_GL_CreateContext(this->m_pWindow);
            this->m_GLContext = pvVar8;
            if (pvVar8 != (SDL_GLContext)0x0) {
              SDL_GL_GetDrawableSize(this->m_pWindow,pScreenWidth,pScreenHeight);
              SDL_GL_SetSwapInterval((uint)Flags >> 1 & 1);
              SDL_GL_MakeCurrent(0,0);
              SDL_GetVersion(&Linked);
              dbg_msg("sdl","SDL version %d.%d.%d (dll = %d.%d.%d)",2,0,0x14,(ulong)Linked.major,
                      (ulong)Linked.minor,(ulong)Linked.patch);
              pIVar9 = (ICommandProcessor *)operator_new(0x20038);
              pIVar9->_vptr_ICommandProcessor = (_func_int **)&PTR__ICommandProcessor_00210cf8;
              mem_zero(pIVar9 + 1,0x20000);
              pIVar9[0x4001]._vptr_ICommandProcessor = (_func_int **)0x0;
              this->m_pProcessor = pIVar9;
              (this->super_CGraphicsBackend_Threaded).m_Shutdown = false;
              (this->super_CGraphicsBackend_Threaded).m_pProcessor = pIVar9;
              pvVar10 = thread_init(CGraphicsBackend_Threaded::ThreadFunc,this);
              (this->super_CGraphicsBackend_Threaded).m_pThread = pvVar10;
              semaphore_signal(&(this->super_CGraphicsBackend_Threaded).m_BufferDone.sem);
              CCommandBuffer::CCommandBuffer(&local_80,0x400,0x200);
              uVar11 = (ulong)local_80.m_CmdBuffer.m_Used;
              uVar16 = (ulong)((int)local_80.m_CmdBuffer.m_pData + local_80.m_CmdBuffer.m_Used & 7);
              uVar15 = (uVar11 - uVar16) + 0x28;
              if (uVar15 <= local_80.m_CmdBuffer.m_Size) {
                pSVar7 = this->m_pWindow;
                pvVar8 = this->m_GLContext;
                lVar3 = uVar11 - uVar16;
                local_80.m_CmdBuffer.m_Used = (uint)uVar15;
                uVar11 = uVar15 & 0xffffffff;
                pCVar13 = (CCommand *)(local_80.m_CmdBuffer.m_pData + lVar3 + 8);
                if (pCVar13 != (CCommand *)0x0) {
                  pCVar13->m_Cmd = 20000;
                  *(SDL_Window **)(local_80.m_CmdBuffer.m_pData + lVar3 + 0x18) = pSVar7;
                  *(SDL_GLContext *)(local_80.m_CmdBuffer.m_pData + lVar3 + 0x20) = pvVar8;
                  puVar1 = local_80.m_CmdBuffer.m_pData + lVar3 + 0x10;
                  puVar1[0] = '\0';
                  puVar1[1] = '\0';
                  puVar1[2] = '\0';
                  puVar1[3] = '\0';
                  puVar1[4] = '\0';
                  puVar1[5] = '\0';
                  puVar1[6] = '\0';
                  puVar1[7] = '\0';
                  if (local_80.m_pCmdBufferTail != (CCommand *)0x0) {
                    (local_80.m_pCmdBufferTail)->m_pNext = pCVar13;
                  }
                  if (local_80.m_pCmdBufferHead == (CCommand *)0x0) {
                    local_80.m_pCmdBufferHead = pCVar13;
                  }
                  uVar11 = uVar15 & 0xffffffff;
                  local_80.m_pCmdBufferTail = pCVar13;
                }
              }
              uVar15 = (ulong)((int)uVar11 + (int)local_80.m_CmdBuffer.m_pData & 7);
              uVar16 = (uVar11 - uVar15) + 0x28;
              if (uVar16 <= local_80.m_CmdBuffer.m_Size) {
                lVar3 = uVar11 - uVar15;
                local_80.m_CmdBuffer.m_Used = (uint)uVar16;
                pCVar13 = (CCommand *)(local_80.m_CmdBuffer.m_pData + lVar3 + 8);
                if (pCVar13 != (CCommand *)0x0) {
                  pCVar13->m_Cmd = 10000;
                  *(int **)(local_80.m_CmdBuffer.m_pData + lVar3 + 0x18) =
                       &this->m_TextureMemoryUsage;
                  *(int **)(local_80.m_CmdBuffer.m_pData + lVar3 + 0x20) = &this->m_TextureArraySize
                  ;
                  puVar1 = local_80.m_CmdBuffer.m_pData + lVar3 + 0x10;
                  puVar1[0] = '\0';
                  puVar1[1] = '\0';
                  puVar1[2] = '\0';
                  puVar1[3] = '\0';
                  puVar1[4] = '\0';
                  puVar1[5] = '\0';
                  puVar1[6] = '\0';
                  puVar1[7] = '\0';
                  if (local_80.m_pCmdBufferTail != (CCommand *)0x0) {
                    (local_80.m_pCmdBufferTail)->m_pNext = pCVar13;
                  }
                  local_80.m_pCmdBufferTail = pCVar13;
                  if (local_80.m_pCmdBufferHead == (CCommand *)0x0) {
                    local_80.m_pCmdBufferHead = pCVar13;
                  }
                }
              }
              (*(this->super_CGraphicsBackend_Threaded).super_IGraphicsBackend.
                _vptr_IGraphicsBackend[0x11])(this,&local_80);
              (*(this->super_CGraphicsBackend_Threaded).super_IGraphicsBackend.
                _vptr_IGraphicsBackend[0x13])(this);
              if (local_80.m_DataBuffer.m_pData != (uchar *)0x0) {
                operator_delete__(local_80.m_DataBuffer.m_pData);
              }
              local_80.m_DataBuffer.m_pData = (uchar *)0x0;
              local_80.m_DataBuffer.m_Size = 0;
              local_80.m_DataBuffer.m_Used = 0;
              if (local_80.m_CmdBuffer.m_pData != (uchar *)0x0) {
                operator_delete__(local_80.m_CmdBuffer.m_pData);
              }
              iVar4 = 0;
              goto LAB_0011cbe6;
            }
            uVar6 = SDL_GetError();
            fmt = "unable to create OpenGL context: %s";
          }
        }
      }
      else {
        uVar6 = SDL_GetError();
        fmt = "unable to retrieve screen information: %s";
      }
    }
  }
  dbg_msg("gfx",fmt,uVar6);
  iVar4 = -1;
LAB_0011cbe6:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return iVar4;
}

Assistant:

int CGraphicsBackend_SDL_OpenGL::Init(const char *pName, int *pScreen, int *pWindowWidth, int *pWindowHeight, int* pScreenWidth, int* pScreenHeight, int FsaaSamples, int Flags, int *pDesktopWidth, int *pDesktopHeight)
{
	if(!SDL_WasInit(SDL_INIT_VIDEO))
	{
		if(SDL_InitSubSystem(SDL_INIT_VIDEO) < 0)
		{
			dbg_msg("gfx", "unable to init SDL video: %s", SDL_GetError());
			return -1;
		}
	}

	// set screen
	SDL_Rect ScreenPos;
	m_NumScreens = SDL_GetNumVideoDisplays();
	if(m_NumScreens > 0)
	{
		*pScreen = clamp(*pScreen, 0, m_NumScreens-1);
		if(SDL_GetDisplayBounds(*pScreen, &ScreenPos) != 0)
		{
			dbg_msg("gfx", "unable to retrieve screen information: %s", SDL_GetError());
			return -1;
		}
	}
	else
	{
		dbg_msg("gfx", "unable to retrieve number of screens: %s", SDL_GetError());
		return -1;
	}

	// store desktop resolution for settings reset button
	if(!GetDesktopResolution(*pScreen, pDesktopWidth, pDesktopHeight))
	{
		dbg_msg("gfx", "unable to get desktop resolution: %s", SDL_GetError());
		return -1;
	}

	// use desktop resolution as default resolution
	if (*pWindowWidth == 0 || *pWindowHeight == 0)
	{
		*pWindowWidth = *pDesktopWidth;
		*pWindowHeight = *pDesktopHeight;
	}

	// set flags
	int SdlFlags = SDL_WINDOW_OPENGL;
	if(Flags&IGraphicsBackend::INITFLAG_HIGHDPI)
		SdlFlags |= SDL_WINDOW_ALLOW_HIGHDPI;
	if(Flags&IGraphicsBackend::INITFLAG_RESIZABLE)
		SdlFlags |= SDL_WINDOW_RESIZABLE;
	if(Flags&IGraphicsBackend::INITFLAG_BORDERLESS)
		SdlFlags |= SDL_WINDOW_BORDERLESS;
	if(Flags&IGraphicsBackend::INITFLAG_FULLSCREEN)
#if defined(CONF_PLATFORM_MACOSX)	// Todo SDL: remove this when fixed (game freezes when losing focus in fullscreen)
	{
		SdlFlags |= SDL_WINDOW_FULLSCREEN_DESKTOP;	// always use "fake" fullscreen
		*pWindowWidth = *pDesktopWidth;
		*pWindowHeight = *pDesktopHeight;
	}
#else
		SdlFlags |= SDL_WINDOW_FULLSCREEN;
#endif

	if(Flags&IGraphicsBackend::INITFLAG_X11XRANDR)
		SDL_SetHint(SDL_HINT_VIDEO_X11_XRANDR, "1");

	// set gl attributes
	SDL_GL_SetAttribute(SDL_GL_DOUBLEBUFFER, 1);
	if(FsaaSamples)
	{
		SDL_GL_SetAttribute(SDL_GL_MULTISAMPLEBUFFERS, 1);
		SDL_GL_SetAttribute(SDL_GL_MULTISAMPLESAMPLES, FsaaSamples);
	}
	else
	{
		SDL_GL_SetAttribute(SDL_GL_MULTISAMPLEBUFFERS, 0);
		SDL_GL_SetAttribute(SDL_GL_MULTISAMPLESAMPLES, 0);
	}

	// calculate centered position in windowed mode
	int OffsetX = 0;
	int OffsetY = 0;
	if(!(Flags&IGraphicsBackend::INITFLAG_FULLSCREEN) && *pDesktopWidth > *pWindowWidth && *pDesktopHeight > *pWindowHeight)
	{
		OffsetX = (*pDesktopWidth - *pWindowWidth) / 2;
		OffsetY = (*pDesktopHeight - *pWindowHeight) / 2;
	}

	// create window
	m_pWindow = SDL_CreateWindow(pName, ScreenPos.x+OffsetX, ScreenPos.y+OffsetY, *pWindowWidth, *pWindowHeight, SdlFlags);
	if(m_pWindow == NULL)
	{
		dbg_msg("gfx", "unable to create window: %s", SDL_GetError());
		return -1;
	}

	SDL_GetWindowSize(m_pWindow, pWindowWidth, pWindowHeight);

	// create gl context
	m_GLContext = SDL_GL_CreateContext(m_pWindow);
	if(m_GLContext == NULL)
	{
		dbg_msg("gfx", "unable to create OpenGL context: %s", SDL_GetError());
		return -1;
	}

	SDL_GL_GetDrawableSize(m_pWindow, pScreenWidth, pScreenHeight); // drawable size may differ in high dpi mode

	#if defined(CONF_FAMILY_WINDOWS)
		glTexImage3DInternal = (PFNGLTEXIMAGE3DPROC) wglGetProcAddress("glTexImage3D");
		if(glTexImage3DInternal == 0)
		{
			dbg_msg("gfx", "glTexImage3D not supported");
			return -1;
		}
	#endif

	SDL_GL_SetSwapInterval(Flags&IGraphicsBackend::INITFLAG_VSYNC ? 1 : 0);

	SDL_GL_MakeCurrent(NULL, NULL);

	// print sdl version
	SDL_version Compiled;
	SDL_version Linked;

	SDL_VERSION(&Compiled);
	SDL_GetVersion(&Linked);
	dbg_msg("sdl", "SDL version %d.%d.%d (dll = %d.%d.%d)", Compiled.major, Compiled.minor, Compiled.patch, Linked.major, Linked.minor, Linked.patch);

	// start the command processor
	m_pProcessor = new CCommandProcessor_SDL_OpenGL;
	StartProcessor(m_pProcessor);

	// issue init commands for OpenGL and SDL
	CCommandBuffer CmdBuffer(1024, 512);
	CCommandProcessorFragment_SDL::CInitCommand CmdSDL;
	CmdSDL.m_pWindow = m_pWindow;
	CmdSDL.m_GLContext = m_GLContext;
	CmdBuffer.AddCommand(CmdSDL);
	CCommandProcessorFragment_OpenGL::CInitCommand CmdOpenGL;
	CmdOpenGL.m_pTextureMemoryUsage = &m_TextureMemoryUsage;
	CmdOpenGL.m_pTextureArraySize = &m_TextureArraySize;
	CmdBuffer.AddCommand(CmdOpenGL);
	RunBuffer(&CmdBuffer);
	WaitForIdle();

	return 0;
}